

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

Format __thiscall QRasterBuffer::prepare(QRasterBuffer *this,QImage *image)

{
  uint uVar1;
  QColorSpacePrivate *pQVar2;
  int iVar3;
  int iVar4;
  Format FVar5;
  uchar *puVar6;
  qsizetype qVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QList<unsigned_int> local_48;
  QColorSpacePrivate *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = QImage::bits(image);
  this->m_buffer = puVar6;
  iVar3 = QImage::width(image);
  if (0x7ffffe < iVar3) {
    iVar3 = 0x7fffff;
  }
  this->m_width = iVar3;
  iVar4 = QImage::height(image);
  iVar3 = 0x7fffff;
  if (iVar4 < 0x7fffff) {
    iVar3 = iVar4;
  }
  this->m_height = iVar3;
  iVar4 = QImage::depth(image);
  iVar3 = iVar4 + 7;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  this->bytes_per_pixel = iVar3 >> 3;
  qVar7 = QImage::bytesPerLine(image);
  this->bytes_per_line = qVar7;
  FVar5 = QImage::format(image);
  this->format = FVar5;
  QImage::colorSpace((QImage *)&local_30);
  pQVar2 = local_30;
  local_30 = (QColorSpacePrivate *)0x0;
  local_48.d.d = (Data *)(this->colorSpace).d_ptr.d.ptr;
  (this->colorSpace).d_ptr.d.ptr = pQVar2;
  QColorSpace::~QColorSpace((QColorSpace *)&local_48);
  QColorSpace::~QColorSpace((QColorSpace *)&local_30);
  iVar3 = QImage::depth(image);
  if (iVar3 == 1) {
    QImage::colorTable(&local_48,image);
    qVar7 = local_48.d.size;
    if ((QColorSpacePrivate *)local_48.d.d != (QColorSpacePrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
      }
    }
    if ((undefined1 *)qVar7 == (undefined1 *)0x2) {
      this->monoDestinationWithClut = true;
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      QImage::colorTable(&local_48,image);
      uVar1 = *local_48.d.ptr;
      uVar9 = (uVar1 & 0xff00ff) * (uVar1 >> 0x18);
      uVar8 = (uVar1 >> 8 & 0xff) * (uVar1 >> 0x18);
      this->destColor0 =
           uVar1 & 0xff000000 | uVar8 + 0x80 + (uVar8 >> 8) & 0xff00 |
           uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      uVar1 = local_48.d.ptr[1];
      uVar9 = (uVar1 & 0xff00ff) * (uVar1 >> 0x18);
      uVar8 = (uVar1 >> 8 & 0xff) * (uVar1 >> 0x18);
      this->destColor1 =
           uVar1 & 0xff000000 | uVar8 + 0x80 + (uVar8 >> 8) & 0xff00 |
           uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      if ((QColorSpacePrivate *)local_48.d.d != (QColorSpacePrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            (((QSharedData *)&(local_48.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this->format;
  }
  __stack_chk_fail();
}

Assistant:

QImage::Format QRasterBuffer::prepare(QImage *image)
{
    m_buffer = (uchar *)image->bits();
    m_width = qMin(QT_RASTER_COORD_LIMIT, image->width());
    m_height = qMin(QT_RASTER_COORD_LIMIT, image->height());
    bytes_per_pixel = image->depth()/8;
    bytes_per_line = image->bytesPerLine();

    format = image->format();
    colorSpace = image->colorSpace();
    if (image->depth() == 1 && image->colorTable().size() == 2) {
        monoDestinationWithClut = true;
        const QList<QRgb> colorTable = image->colorTable();
        destColor0 = qPremultiply(colorTable[0]);
        destColor1 = qPremultiply(colorTable[1]);
    }

    return format;
}